

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O1

SquareMatrix<std::complex<double>_> __thiscall
qclab::dense::operator-
          (dense *this,SquareMatrix<std::complex<double>_> *lhs,
          SquareMatrix<std::complex<double>_> *rhs)

{
  double dVar1;
  complex<double> *pcVar2;
  complex<double> *pcVar3;
  long lVar4;
  long lVar5;
  data_type extraout_RDX;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  SquareMatrix<std::complex<double>_> SVar10;
  
  if (rhs->size_ == lhs->size_) {
    if (0 < lhs->size_) {
      lVar4 = 0;
      lVar5 = 0;
      do {
        lVar6 = lhs->size_;
        if (0 < lVar6) {
          lVar7 = 8;
          lVar8 = 0;
          do {
            lVar9 = rhs->size_ * lVar4;
            pcVar2 = (rhs->data_)._M_t.
                     super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                     .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
            lVar6 = lVar6 * lVar4;
            pcVar3 = (lhs->data_)._M_t.
                     super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                     .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
            dVar1 = *(double *)(pcVar2->_M_value + lVar7 + lVar9);
            *(double *)(pcVar3->_M_value + lVar7 + -8 + lVar6) =
                 *(double *)(pcVar3->_M_value + lVar7 + -8 + lVar6) -
                 *(double *)(pcVar2->_M_value + lVar7 + -8 + lVar9);
            *(double *)(pcVar3->_M_value + lVar7 + lVar6) =
                 *(double *)(pcVar3->_M_value + lVar7 + lVar6) - dVar1;
            lVar8 = lVar8 + 1;
            lVar6 = lhs->size_;
            lVar7 = lVar7 + 0x10;
          } while (lVar8 < lVar6);
        }
        lVar5 = lVar5 + 1;
        lVar4 = lVar4 + 0x10;
      } while (lVar5 < lhs->size_);
    }
    SquareMatrix<std::complex<double>_>::SquareMatrix
              ((SquareMatrix<std::complex<double>_> *)this,lhs);
    SVar10.data_._M_t.
    super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
    super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
         extraout_RDX._M_t.
         super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
         _M_t.
         super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
         .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
    SVar10.size_ = (size_type_conflict)this;
    return SVar10;
  }
  __assert_fail("rhs.size() == size_",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/SquareMatrix.hpp"
                ,0xa4,
                "SquareMatrix<T> &qclab::dense::SquareMatrix<std::complex<double>>::operator-=(const SquareMatrix<T> &) [T = std::complex<double>]"
               );
}

Assistant:

inline SquareMatrix< T >& operator-=( const SquareMatrix< T >& rhs ) {
          assert( rhs.size() == size_ ) ;
          #pragma omp parallel for
          for ( int64_t j = 0; j < size_; j++ ) {
            for ( int64_t i = 0; i < size_; i++ ) {
              (*this)(i,j) -= rhs(i,j) ;
            }
          }
          return *this ;
        }